

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int robust_open(char *z,int f,mode_t m)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  stat statbuf;
  undefined1 local_c0 [24];
  uint local_a8;
  long local_90;
  
  uVar4 = 0x1a4;
  if (m != 0) {
    uVar4 = m;
  }
  do {
    while( true ) {
      uVar1 = (*aSyscall[0].pCurrent)(z,(ulong)(f | 0x80000),(ulong)uVar4);
      if (-1 < (int)uVar1) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) goto LAB_0013a810;
    }
    if (2 < (int)uVar1) goto LAB_0013a810;
    (*aSyscall[1].pCurrent)((ulong)uVar1);
    sqlite3_log(0x1c,"attempt to open \"%s\" as file descriptor %d",z,(ulong)uVar1);
    iVar2 = (*aSyscall[0].pCurrent)("/dev/null",(ulong)(uint)f,(ulong)m);
  } while (-1 < iVar2);
  uVar1 = 0xffffffff;
LAB_0013a810:
  if ((((-1 < (int)uVar1 && m != 0) &&
       (iVar2 = (*aSyscall[5].pCurrent)((ulong)uVar1,local_c0), iVar2 == 0)) && (local_90 == 0)) &&
     ((local_a8 & 0x1ff) != m)) {
    (*aSyscall[0xe].pCurrent)((ulong)uVar1,(ulong)m);
  }
  return uVar1;
}

Assistant:

static int robust_open(const char *z, int f, mode_t m){
  int fd;
  mode_t m2 = m ? m : SQLITE_DEFAULT_FILE_PERMISSIONS;
  while(1){
#if defined(O_CLOEXEC)
    fd = osOpen(z,f|O_CLOEXEC,m2);
#else
    fd = osOpen(z,f,m2);
#endif
    if( fd<0 ){
      if( errno==EINTR ) continue;
      break;
    }
    if( fd>=SQLITE_MINIMUM_FILE_DESCRIPTOR ) break;
    osClose(fd);
    sqlite3_log(SQLITE_WARNING, 
                "attempt to open \"%s\" as file descriptor %d", z, fd);
    fd = -1;
    if( osOpen("/dev/null", f, m)<0 ) break;
  }
  if( fd>=0 ){
    if( m!=0 ){
      struct stat statbuf;
      if( osFstat(fd, &statbuf)==0 
       && statbuf.st_size==0
       && (statbuf.st_mode&0777)!=m 
      ){
        osFchmod(fd, m);
      }
    }
#if defined(FD_CLOEXEC) && (!defined(O_CLOEXEC) || O_CLOEXEC==0)
    osFcntl(fd, F_SETFD, osFcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif
  }
  return fd;
}